

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

void __thiscall OpenMD::EAM::initialize(EAM *this)

{
  _Rb_tree_header *p_Var1;
  int nr;
  pointer piVar2;
  ForceField *pFVar3;
  pointer pcVar4;
  undefined8 uVar5;
  bool bVar6;
  _Base_ptr p_Var7;
  AtomType *this_00;
  AtomType *this_01;
  long lVar8;
  NonBondedInteractionType *this_02;
  KeyType keys;
  vector<double,_std::allocator<double>_> phiAB;
  string EAMMixMeth;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_b8;
  MapTypeIterator local_98;
  RealType local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  std::__cxx11::string::string
            ((string *)&local_88,
             (string *)&(this->forceField_->forceFieldOptions_).EAMMixingMethod.data_);
  std::locale::locale((locale *)&local_b8);
  toUpper<std::__cxx11::string>(&local_88,(locale *)&local_b8);
  std::locale::~locale((locale *)&local_b8);
  bVar6 = std::operator==(&local_88,"JOHNSON");
  if (bVar6) {
    this->mixMeth_ = eamJohnson;
  }
  else {
    bVar6 = std::operator==(&local_88,"DREAM1");
    if (bVar6) {
      this->mixMeth_ = eamDream1;
    }
    else {
      bVar6 = std::operator==(&local_88,"DREAM2");
      if (bVar6) {
        this->mixMeth_ = eamDream2;
      }
      else {
        bVar6 = std::operator==(&local_88,"DAW");
        if (bVar6) {
          this->mixMeth_ = eamDaw;
        }
        else {
          this->mixMeth_ = eamUnknownMix;
        }
      }
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->EAMtypes)._M_t);
  piVar2 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::clear(&this->EAMdata);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::clear(&this->MixingMap);
  this->nEAM_ = 0;
  local_b8._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->EAMtids,
             (this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
             _M_node_count,(value_type_conflict2 *)&local_b8);
  p_Var1 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var7 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    bVar6 = AtomType::isEAM(*(AtomType **)(p_Var7 + 1));
    if (bVar6) {
      this->nEAM_ = this->nEAM_ + 1;
    }
  }
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::resize
            (&this->EAMdata,(long)this->nEAM_);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize(&this->MixingMap,(long)this->nEAM_);
  for (p_Var7 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    bVar6 = AtomType::isEAM(*(AtomType **)(p_Var7 + 1));
    if (bVar6) {
      addType(this,*(AtomType **)(p_Var7 + 1));
    }
  }
  pFVar3 = this->forceField_;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_node =
       (pFVar3->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  if ((_Rb_tree_header *)local_98._M_node ==
      &(pFVar3->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header) {
    this_02 = (NonBondedInteractionType *)0x0;
  }
  else {
    this_02 = *(NonBondedInteractionType **)(local_98._M_node + 2);
  }
  do {
    if (this_02 == (NonBondedInteractionType *)0x0) {
      this->initialized_ = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      std::__cxx11::string::~string((string *)&local_88);
      return;
    }
    bVar6 = NonBondedInteractionType::isEAMTable(this_02);
    if (bVar6) {
LAB_002098e4:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_98._M_node + 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_d8,&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8);
      this_00 = ForceField::getAtomType
                          (this->forceField_,
                           local_d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      if (this_00 == (AtomType *)0x0) {
        pcVar4 = ((local_d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        snprintf(painCave.errMsg,2000,
                 "EAM::initialize could not find AtomType %s\n\tfor %s - %s explicit interaction.\n"
                 ,pcVar4,pcVar4,
                 local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      this_01 = ForceField::getAtomType
                          (this->forceField_,
                           local_d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
      if (this_01 == (AtomType *)0x0) {
        pcVar4 = local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        snprintf(painCave.errMsg,2000,
                 "EAM::initialize could not find AtomType %s\n\tfor %s - %s explicit interaction.\n"
                 ,pcVar4,((local_d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,pcVar4);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      lVar8 = __dynamic_cast(this_02,&NonBondedInteractionType::typeinfo,
                             &EAMInteractionType::typeinfo,0);
      if (lVar8 == 0) {
        AtomType::getName_abi_cxx11_(&local_b8,this_00);
        uVar5 = CONCAT44(local_b8._M_dataplus._M_p._4_4_,local_b8._M_dataplus._M_p._0_4_);
        AtomType::getName_abi_cxx11_(&local_68,this_01);
        snprintf(painCave.errMsg,2000,
                 "EAM::initialize could not convert NonBondedInteractionType\n\tto EAMInteractionType for %s - %s interaction.\n"
                 ,uVar5,local_68._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_b8);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      bVar6 = NonBondedInteractionType::isEAMTable(this_02);
      if (bVar6) {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_b8,
                   (vector<double,_std::allocator<double>_> *)(lVar8 + 0x78));
        local_90 = *(RealType *)(lVar8 + 0x68);
        nr = *(int *)(lVar8 + 0x60);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_48,
                   (vector<double,_std::allocator<double>_> *)&local_b8);
        addExplicitInteraction
                  (this,this_00,this_01,local_90,nr,
                   (vector<double,_std::allocator<double>_> *)&local_48);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&local_b8);
      }
      else {
        bVar6 = NonBondedInteractionType::isEAMZhou(this_02);
        if (bVar6) {
          addExplicitInteraction
                    (this,this_00,this_01,*(RealType *)(lVar8 + 0x90),*(RealType *)(lVar8 + 0x98),
                     *(RealType *)(lVar8 + 0xa0),*(RealType *)(lVar8 + 0xa8),
                     *(RealType *)(lVar8 + 0xb0),*(RealType *)(lVar8 + 0xb8),
                     *(RealType *)(lVar8 + 0xc0));
        }
        else {
          bVar6 = NonBondedInteractionType::isEAMOxides(this_02);
          if (bVar6) {
            addExplicitInteraction
                      (this,this_00,this_01,*(RealType *)(lVar8 + 0x90),*(RealType *)(lVar8 + 0x98),
                       *(RealType *)(lVar8 + 0xa8),*(RealType *)(lVar8 + 200),
                       *(RealType *)(lVar8 + 0xd0));
          }
        }
      }
    }
    else {
      bVar6 = NonBondedInteractionType::isEAMZhou(this_02);
      if (bVar6) goto LAB_002098e4;
      bVar6 = NonBondedInteractionType::isEAMOxides(this_02);
      if (bVar6) goto LAB_002098e4;
    }
    this_02 = TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType
                        (&pFVar3->nonBondedInteractionTypeCont_,&local_98);
  } while( true );
}

Assistant:

void EAM::initialize() {
    // set up the mixing method:
    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
    string EAMMixMeth        = fopts.getEAMMixingMethod();
    toUpper(EAMMixMeth);
    if (EAMMixMeth == "JOHNSON")
      mixMeth_ = eamJohnson;
    else if (EAMMixMeth == "DREAM1")
      mixMeth_ = eamDream1;
    else if (EAMMixMeth == "DREAM2")
      mixMeth_ = eamDream2;
    else if (EAMMixMeth == "DAW")
      mixMeth_ = eamDaw;
    else
      mixMeth_ = eamUnknownMix;

    // find all of the EAM atom Types:
    EAMtypes.clear();
    EAMtids.clear();
    EAMdata.clear();
    MixingMap.clear();
    nEAM_ = 0;

    EAMtids.resize(forceField_->getNAtomType(), -1);

    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isEAM()) nEAM_++;
    }
    EAMdata.resize(nEAM_);
    MixingMap.resize(nEAM_);

    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isEAM()) addType(*at);
    }

    // find all of the explicit EAM interactions:
    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isEAMTable() || nbt->isEAMZhou() || nbt->isEAMOxides()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAM::initialize could not find AtomType %s\n"
                   "\tfor %s - %s explicit interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAM::initialize could not find AtomType %s\n"
                   "\tfor %s - %s explicit interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        EAMInteractionType* eamit = dynamic_cast<EAMInteractionType*>(nbt);

        if (eamit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "EAM::initialize could not convert NonBondedInteractionType\n"
              "\tto EAMInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
        if (nbt->isEAMTable()) {
          vector<RealType> phiAB = eamit->getPhi();
          RealType dr            = eamit->getDr();
          int nr                 = eamit->getNr();

          addExplicitInteraction(at1, at2, dr, nr, phiAB);

        } else if (nbt->isEAMZhou()) {
          RealType re     = eamit->getRe();
          RealType alpha  = eamit->getAlpha();
          RealType beta   = eamit->getBeta();
          RealType A      = eamit->getA();
          RealType B      = eamit->getB();
          RealType kappa  = eamit->getKappa();
          RealType lambda = eamit->getLambda();

          addExplicitInteraction(at1, at2, re, alpha, beta, A, B, kappa,
                                 lambda);

        } else if (nbt->isEAMOxides()) {
          RealType re    = eamit->getRe();
          RealType alpha = eamit->getAlpha();
          RealType A     = eamit->getA();
          RealType Ci    = eamit->getCi();
          RealType Cj    = eamit->getCj();
          addExplicitInteraction(at1, at2, re, alpha, A, Ci, Cj);
        }
      }
    }
    initialized_ = true;
  }